

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

void __thiscall
icu_63::TimeZone::getOffset
          (TimeZone *this,UDate date,UBool local,int32_t *rawOffset,int32_t *dstOffset,
          UErrorCode *ec)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  int *local_48;
  double local_40;
  int32_t doy_unused;
  
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    local_48 = dstOffset;
    iVar2 = (*(this->super_UObject)._vptr_UObject[8])();
    *rawOffset = iVar2;
    if (local == '\0') {
      date = date + (double)iVar2;
    }
    bVar1 = 1;
    while( true ) {
      local_40 = uprv_floor_63(date / 86400000.0);
      Grego::dayToFields(local_40,&year,&month,&dom,&dow,&doy_unused);
      iVar2 = 0;
      if ((year & 3U) == 0) {
        uVar4 = year * -0x3d70a3d7 + 0x51eb850;
        iVar2 = 0xc;
        if (((uVar4 >> 2 | year * 0x40000000) < 0x28f5c29) &&
           (iVar2 = 0, (uVar4 >> 4 | year * -0x70000000) < 0xa3d70b)) {
          iVar2 = 0xc;
        }
      }
      iVar3 = (*(this->super_UObject)._vptr_UObject[5])
                        (this,1,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)dom,
                         (ulong)(byte)dow,(ulong)(uint)(int)(date - local_40 * 86400000.0),
                         (ulong)(uint)(int)(char)Grego::MONTH_LENGTH[iVar2 + month],ec);
      iVar2 = *rawOffset;
      iVar5 = iVar3 - iVar2;
      *local_48 = iVar5;
      if (((bool)(~bVar1 & 1 | local == '\0')) || (iVar3 == iVar2)) break;
      date = date - (double)iVar5;
      bVar1 = 0;
    }
  }
  return;
}

Assistant:

void TimeZone::getOffset(UDate date, UBool local, int32_t& rawOffset,
                         int32_t& dstOffset, UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return;
    }

    rawOffset = getRawOffset();
    if (!local) {
        date += rawOffset; // now in local standard millis
    }

    // When local == TRUE, date might not be in local standard
    // millis.  getOffset taking 7 parameters used here assume
    // the given time in day is local standard time.
    // At STD->DST transition, there is a range of time which
    // does not exist.  When 'date' is in this time range
    // (and local == TRUE), this method interprets the specified
    // local time as DST.  At DST->STD transition, there is a
    // range of time which occurs twice.  In this case, this
    // method interprets the specified local time as STD.
    // To support the behavior above, we need to call getOffset
    // (with 7 args) twice when local == true and DST is
    // detected in the initial call.
    for (int32_t pass=0; ; ++pass) {
        int32_t year, month, dom, dow;
        double day = uprv_floor(date / U_MILLIS_PER_DAY);
        int32_t millis = (int32_t) (date - day * U_MILLIS_PER_DAY);

        Grego::dayToFields(day, year, month, dom, dow);

        dstOffset = getOffset(GregorianCalendar::AD, year, month, dom,
                              (uint8_t) dow, millis,
                              Grego::monthLength(year, month),
                              ec) - rawOffset;

        // Recompute if local==TRUE, dstOffset!=0.
        if (pass!=0 || !local || dstOffset == 0) {
            break;
        }
        // adjust to local standard millis
        date -= dstOffset;
    }
}